

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

void __thiscall spvtools::Optimizer::SetMessageConsumer(Optimizer *this,MessageConsumer *c)

{
  _Head_base<0UL,_spvtools::Optimizer::Impl_*,_false> _Var1;
  _Manager_type p_Var2;
  Pass *pPVar3;
  uint32_t i;
  uint index;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  _Any_data local_50;
  code *local_40;
  
  index = 0;
  while( true ) {
    _Var1._M_head_impl =
         (this->impl_)._M_t.
         super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
         .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
    if ((uint)((ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->pass_manager + 0x28) -
                      *(long *)&((vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
                                  *)((long)&(_Var1._M_head_impl)->pass_manager + 0x20))->
                                super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
                      ) >> 3) <= index) break;
    pPVar3 = opt::PassManager::GetPass(&(_Var1._M_head_impl)->pass_manager,index);
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
              *)&local_50,c);
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator=(&pPVar3->consumer_,
              (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
               *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    index = index + 1;
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (_Manager_type)0x0;
  local_60 = c->_M_invoker;
  p_Var2 = (c->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_78._M_unused._0_8_ = (undefined8)*(undefined8 *)&(c->super__Function_base)._M_functor;
    local_78._8_8_ = *(undefined8 *)((long)&(c->super__Function_base)._M_functor + 8);
    (c->super__Function_base)._M_manager = (_Manager_type)0x0;
    c->_M_invoker = (_Invoker_type)0x0;
    local_68 = p_Var2;
  }
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  operator=(&((_Var1._M_head_impl)->pass_manager).consumer_,
            (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
             *)&local_78);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  return;
}

Assistant:

void Optimizer::SetMessageConsumer(MessageConsumer c) {
  // All passes' message consumer needs to be updated.
  for (uint32_t i = 0; i < impl_->pass_manager.NumPasses(); ++i) {
    impl_->pass_manager.GetPass(i)->SetMessageConsumer(c);
  }
  impl_->pass_manager.SetMessageConsumer(std::move(c));
}